

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O2

int glfwGetPhysicalDevicePresentationSupport
              (VkInstance instance,VkPhysicalDevice device,uint32_t queuefamily)

{
  GLFWbool GVar1;
  int iVar2;
  char *format;
  
  if (_glfwInitialized == 0) {
    iVar2 = 0x10001;
    format = (char *)0x0;
  }
  else {
    GVar1 = _glfwInitVulkan();
    if (GVar1 != 0) {
      iVar2 = _glfwPlatformGetPhysicalDevicePresentationSupport(instance,device,queuefamily);
      return iVar2;
    }
    format = "Vulkan: API not available";
    iVar2 = 0x10006;
  }
  _glfwInputError(iVar2,format);
  return 0;
}

Assistant:

GLFWAPI int glfwGetPhysicalDevicePresentationSupport(VkInstance instance,
                                                     VkPhysicalDevice device,
                                                     uint32_t queuefamily)
{
    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (!_glfwInitVulkan())
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "Vulkan: API not available");
        return GLFW_FALSE;
    }

    if (!_glfw.vk.extensions)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE,
                        "Vulkan: Window surface creation extensions not found");
        return GLFW_FALSE;
    }

    return _glfwPlatformGetPhysicalDevicePresentationSupport(instance,
                                                             device,
                                                             queuefamily);
}